

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsystem_netconf.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  int __fd;
  int iVar2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  char *pcVar6;
  LIBSSH2_CHANNEL *channel;
  char *pcVar7;
  size_t sVar8;
  byte bVar9;
  FILE *pFVar10;
  char *pcVar11;
  long lVar12;
  bool bVar13;
  ssize_t len;
  sockaddr_in sin;
  char buf [1048576];
  
  if (((1 < argc) && (server_ip = argv[1], argc != 2)) && (username = argv[2], 3 < (uint)argc)) {
    password = argv[3];
  }
  uVar1 = libssh2_init(0);
  if (uVar1 != 0) {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar1);
    return 1;
  }
  __fd = socket(2,1,6);
  if (__fd == -1) {
    fwrite("failed to open socket!\n",0x17,1,_stderr);
    goto LAB_00101449;
  }
  sin.sin_family = 2;
  sin.sin_addr.s_addr = inet_addr(server_ip);
  if (sin.sin_addr.s_addr == 0xffffffff) {
    pcVar11 = "inet_addr: Invalid IP address \"%s\"\n";
    pcVar6 = server_ip;
    pFVar10 = _stderr;
LAB_00101431:
    fprintf(pFVar10,pcVar11,pcVar6);
  }
  else {
    sin.sin_port = 0x3e03;
    iVar2 = connect(__fd,(sockaddr *)&sin,0x10);
    pFVar10 = _stderr;
    if (iVar2 != 0) {
      pcVar6 = inet_ntoa((in_addr)sin.sin_addr.s_addr);
      pcVar11 = "Failed to connect to %s!\n";
      goto LAB_00101431;
    }
    lVar3 = libssh2_session_init_ex(0,0,0,0);
    if (lVar3 == 0) {
      fwrite("Could not initialize SSH session!\n",0x22,1,_stderr);
    }
    else {
      uVar1 = libssh2_session_handshake(lVar3,__fd);
      if (uVar1 == 0) {
        lVar4 = libssh2_hostkey_hash(lVar3,2);
        fwrite("Fingerprint: ",0xd,1,_stderr);
        for (lVar12 = 0; lVar12 != 0x14; lVar12 = lVar12 + 1) {
          fprintf(_stderr,"%02X ",(ulong)*(byte *)(lVar4 + lVar12));
        }
        fputc(10,_stderr);
        pcVar6 = username;
        sVar5 = strlen(username);
        pcVar6 = (char *)libssh2_userauth_list(lVar3,pcVar6,sVar5 & 0xffffffff);
        if (pcVar6 == (char *)0x0) {
LAB_00101521:
          channel = (LIBSSH2_CHANNEL *)libssh2_channel_open_ex(lVar3,"session",7,0x200000,0x8000,0);
          if (channel != (LIBSSH2_CHANNEL *)0x0) {
            iVar2 = libssh2_channel_process_startup(channel,"subsystem",9,"netconf",7);
            if (iVar2 == 0) {
              fwrite("Sending NETCONF client <hello>\n",0x1f,1,_stderr);
              snprintf(buf,0x100000,
                       "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<hello><capabilities><capability>urn:ietf:params:xml:ns:netconf:base:1.0</capability></capabilities></hello>\n]]>]]>\n%n"
                       ,&len);
              iVar2 = netconf_write(channel,buf,len);
              if (iVar2 != -1) {
                pFVar10 = _stderr;
                fwrite("Reading NETCONF server <hello>\n",0x1f,1,_stderr);
                len = netconf_read_until(channel,"</hello>",buf,(size_t)pFVar10);
                if (len != 0xffffffffffffffff) {
                  fprintf(_stderr,"Got %d bytes:\n----------------------\n%s",len & 0xffffffff,buf);
                  fwrite("Sending NETCONF <rpc>\n",0x16,1,_stderr);
                  snprintf(buf,0x100000,
                           "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<rpc xmlns=\"urn:ietf:params:xml:ns:netconf:base:1.0\"><get-interface-information><terse/></get-interface-information></rpc>\n]]>]]>\n%n"
                           ,&len);
                  iVar2 = netconf_write(channel,buf,len);
                  if (iVar2 != -1) {
                    pFVar10 = _stderr;
                    fwrite("Reading NETCONF <rpc-reply>\n",0x1c,1,_stderr);
                    len = netconf_read_until(channel,"</rpc-reply>",buf,(size_t)pFVar10);
                    if (len != 0xffffffffffffffff) {
                      fprintf(_stderr,"Got %d bytes:\n----------------------\n%s",len & 0xffffffff,
                              buf);
                    }
                  }
                }
              }
            }
            else {
              fwrite("Could not execute the \"netconf\" subsystem!\n(Note that this can be a problem at the server! Please review the server logs.)\n"
                     ,0x7b,1,_stderr);
            }
            libssh2_channel_free(channel);
            goto LAB_001018ae;
          }
          pcVar6 = 
          "Could not open the channel!\n(Note that this can be a problem at the server! Please review the server logs.)\n"
          ;
          sVar5 = 0x6c;
        }
        else {
          fprintf(_stderr,"Authentication methods: %s\n",pcVar6);
          pcVar11 = strstr(pcVar6,"password");
          bVar13 = pcVar11 != (char *)0x0;
          pcVar7 = strstr(pcVar6,"publickey");
          pcVar6 = username;
          bVar9 = bVar13 + 2;
          if (pcVar7 == (char *)0x0) {
            bVar9 = bVar13;
          }
          if (4 < argc) {
            if (((pcVar11 != (char *)0x0) && (pcVar11 = argv[4], *pcVar11 == '-')) &&
               ((pcVar11[1] == 'p' && (pcVar11[2] == '\0')))) {
              bVar9 = 0;
              bVar13 = true;
            }
            if ((((bVar9 & 2) != 0) && (pcVar11 = argv[4], *pcVar11 == '-')) &&
               ((pcVar11[1] == 'k' && (pcVar11[2] == '\0')))) {
              bVar9 = 2;
              bVar13 = false;
            }
          }
          if (bVar13) {
            sVar5 = strlen(username);
            pcVar11 = password;
            sVar8 = strlen(password);
            iVar2 = libssh2_userauth_password_ex
                              (lVar3,pcVar6,sVar5 & 0xffffffff,pcVar11,sVar8 & 0xffffffff,0);
            if (iVar2 == 0) goto LAB_00101521;
            pcVar6 = "Authentication by password failed!\n";
            sVar5 = 0x23;
          }
          else {
            if ((bVar9 & 2) == 0) {
              fwrite("No supported authentication methods found!\n",0x2b,1,_stderr);
              goto LAB_001018ae;
            }
            sVar5 = strlen(username);
            iVar2 = libssh2_userauth_publickey_fromfile_ex
                              (lVar3,pcVar6,sVar5 & 0xffffffff,"/home/username/.ssh/id_rsa.pub",
                               "/home/username/.ssh/id_rsa",password);
            if (iVar2 == 0) {
              fwrite("Authentication by public key succeeded.\n",0x28,1,_stderr);
              goto LAB_00101521;
            }
            pcVar6 = "Authentication by public key failed!\n";
            sVar5 = 0x25;
          }
        }
        fwrite(pcVar6,sVar5,1,_stderr);
      }
      else {
        fprintf(_stderr,"Error when starting up SSH session: %d\n",(ulong)uVar1);
      }
LAB_001018ae:
      libssh2_session_disconnect_ex(lVar3,0xb,"Normal Shutdown","");
      libssh2_session_free(lVar3);
    }
  }
  shutdown(__fd,2);
  close(__fd);
LAB_00101449:
  libssh2_exit();
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    int i, auth = AUTH_NONE;
    struct sockaddr_in sin;
    const char *fingerprint;
    char *userauthlist;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_CHANNEL *channel = NULL;
    char buf[1048576]; /* avoid any buffer reallocation for simplicity */
    ssize_t len;
    libssh2_socket_t sock;

#ifdef WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1)
        server_ip = argv[1];
    if(argc > 2)
        username = argv[2];
    if(argc > 3)
        password = argv[3];

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    /* Connect to SSH server */
    sock = socket(PF_INET, SOCK_STREAM, IPPROTO_TCP);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to open socket!\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_addr.s_addr = inet_addr(server_ip);
    if(INADDR_NONE == sin.sin_addr.s_addr) {
        fprintf(stderr, "inet_addr: Invalid IP address \"%s\"\n", server_ip);
        goto shutdown;
    }
    sin.sin_port = htons(830);
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "Failed to connect to %s!\n", inet_ntoa(sin.sin_addr));
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session!\n");
        goto shutdown;
    }

    /* ... start it up. This will trade welcome banners, exchange keys,
     * and setup crypto, compression, and MAC layers
     */
    rc = libssh2_session_handshake(session, sock);
    if(rc) {
        fprintf(stderr, "Error when starting up SSH session: %d\n", rc);
        goto shutdown;
    }

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++)
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    fprintf(stderr, "\n");

    /* check what authentication methods are available */
    userauthlist = libssh2_userauth_list(session, username,
                                         (unsigned int)strlen(username));
    if(userauthlist) {
        fprintf(stderr, "Authentication methods: %s\n", userauthlist);
        if(strstr(userauthlist, "password"))
            auth |= AUTH_PASSWORD;
        if(strstr(userauthlist, "publickey"))
            auth |= AUTH_PUBLICKEY;

        /* check for options */
        if(argc > 4) {
            if((auth & AUTH_PASSWORD) && !strcmp(argv[4], "-p"))
                auth = AUTH_PASSWORD;
            if((auth & AUTH_PUBLICKEY) && !strcmp(argv[4], "-k"))
                auth = AUTH_PUBLICKEY;
        }

        if(auth & AUTH_PASSWORD) {
            if(libssh2_userauth_password(session, username, password)) {
                fprintf(stderr, "Authentication by password failed!\n");
                goto shutdown;
            }
        }
        else if(auth & AUTH_PUBLICKEY) {
            if(libssh2_userauth_publickey_fromfile(session, username,
                                                   pubkey, privkey,
                                                   password)) {
                fprintf(stderr, "Authentication by public key failed!\n");
                goto shutdown;
            }
            else {
                fprintf(stderr, "Authentication by public key succeeded.\n");
            }
        }
        else {
            fprintf(stderr, "No supported authentication methods found!\n");
            goto shutdown;
        }
    }

    /* open a channel */
    channel = libssh2_channel_open_session(session);
    if(!channel) {
        fprintf(stderr, "Could not open the channel!\n"
                        "(Note that this can be a problem at the server!"
                       " Please review the server logs.)\n");
        goto shutdown;
    }

    /* execute the subsystem on our channel */
    if(libssh2_channel_subsystem(channel, "netconf")) {
        fprintf(stderr, "Could not execute the \"netconf\" subsystem!\n"
                        "(Note that this can be a problem at the server!"
                        " Please review the server logs.)\n");
        goto shutdown;
    }

    /* NETCONF: https://tools.ietf.org/html/draft-ietf-netconf-ssh-06 */

    fprintf(stderr, "Sending NETCONF client <hello>\n");
    snprintf(buf, sizeof(buf),
      "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
      "<hello>"
      "<capabilities>"
      "<capability>urn:ietf:params:xml:ns:netconf:base:1.0</capability>"
      "</capabilities>"
      "</hello>\n"
      "]]>]]>\n%n", (int *)&len);
    if(-1 == netconf_write(channel, buf, len))
        goto shutdown;

    fprintf(stderr, "Reading NETCONF server <hello>\n");
    len = netconf_read_until(channel, "</hello>", buf, sizeof(buf));
    if(-1 == len)
        goto shutdown;

    fprintf(stderr, "Got %d bytes:\n----------------------\n%s",
            (int)len, buf);

    fprintf(stderr, "Sending NETCONF <rpc>\n");
    snprintf(buf, sizeof(buf),
      "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
      "<rpc xmlns=\"urn:ietf:params:xml:ns:netconf:base:1.0\">"
      "<get-interface-information><terse/></get-interface-information>"
      "</rpc>\n"
      "]]>]]>\n%n", (int *)&len);
    if(-1 == netconf_write(channel, buf, len))
        goto shutdown;

    fprintf(stderr, "Reading NETCONF <rpc-reply>\n");
    len = netconf_read_until(channel, "</rpc-reply>", buf, sizeof(buf));
    if(-1 == len)
        goto shutdown;

    fprintf(stderr, "Got %d bytes:\n----------------------\n%s",
            (int)len, buf);

shutdown:

    if(channel)
        libssh2_channel_free(channel);

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
#ifdef WIN32
        closesocket(sock);
#else
        close(sock);
#endif
    }

    libssh2_exit();

    return 0;
}